

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_util_tracek(lua_State *L)

{
  TValue *pTVar1;
  uint64_t uVar2;
  int32_t iVar3;
  uint uVar4;
  GCtrace *pGVar5;
  ptrdiff_t oldtop;
  IRIns *pIStack_48;
  int32_t slot;
  IRIns *ir;
  IRRef ref;
  GCtrace *T;
  lua_State *L_local;
  
  pGVar5 = jit_checktrace(L);
  iVar3 = lj_lib_checkint(L,2);
  uVar4 = iVar3 + 0x8000;
  if (((pGVar5 == (GCtrace *)0x0) || (uVar4 < pGVar5->nk)) || (0x7fff < uVar4)) {
    L_local._0_4_ = 0;
  }
  else {
    pIStack_48 = pGVar5->ir + uVar4;
    oldtop._4_4_ = 0xffffffff;
    if ((pIStack_48->field_1).o == '\x1e') {
      oldtop._4_4_ = (uint)(pIStack_48->field_0).op2;
      pIStack_48 = pGVar5->ir + (pIStack_48->field_0).op1;
    }
    if (((pIStack_48->field_1).o == '\x1d') && (*(long *)((L->glref).ptr64 + 0x180) == 0)) {
      pTVar1 = L->top;
      uVar2 = (L->stack).ptr64;
      luaopen_ffi(L);
      L->top = (TValue *)((long)pTVar1 + ((L->stack).ptr64 - uVar2));
    }
    lj_ir_kvalue(L,L->top + -2,pIStack_48);
    L->top[-1].n = (double)((pIStack_48->field_1).t.irt & 0x1f);
    if (oldtop._4_4_ == 0xffffffff) {
      L_local._0_4_ = 2;
    }
    else {
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      pTVar1->n = (double)(int)oldtop._4_4_;
      L_local._0_4_ = 3;
    }
  }
  return (int)L_local;
}

Assistant:

LJLIB_CF(jit_util_tracek)
{
  GCtrace *T = jit_checktrace(L);
  IRRef ref = (IRRef)lj_lib_checkint(L, 2) + REF_BIAS;
  if (T && ref >= T->nk && ref < REF_BIAS) {
    IRIns *ir = &T->ir[ref];
    int32_t slot = -1;
    if (ir->o == IR_KSLOT) {
      slot = ir->op2;
      ir = &T->ir[ir->op1];
    }
#if LJ_HASFFI
    if (ir->o == IR_KINT64) ctype_loadffi(L);
#endif
    lj_ir_kvalue(L, L->top-2, ir);
    setintV(L->top-1, (int32_t)irt_type(ir->t));
    if (slot == -1)
      return 2;
    setintV(L->top++, slot);
    return 3;
  }
  return 0;
}